

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O2

int __thiscall leveldb::Slice::compare(Slice *this,Slice *b)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong __n;
  uint uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = this->size_;
  uVar3 = b->size_;
  bVar6 = uVar2 < uVar3;
  __n = uVar3;
  if (bVar6) {
    __n = uVar2;
  }
  uVar5 = 0xffffffff;
  if (!bVar6) {
    uVar5 = (uint)(!bVar6 && uVar2 != uVar3);
  }
  uVar4 = memcmp(this->data_,b->data_,__n);
  if (uVar4 != 0) {
    uVar5 = uVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar5;
  }
  __stack_chk_fail();
}

Assistant:

inline int Slice::compare(const Slice& b) const {
  const size_t min_len = (size_ < b.size_) ? size_ : b.size_;
  int r = memcmp(data_, b.data_, min_len);
  if (r == 0) {
    if (size_ < b.size_)
      r = -1;
    else if (size_ > b.size_)
      r = +1;
  }
  return r;
}